

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

int Sfm_NodeReadUsed(Sfm_Ntk_t *p,int i)

{
  uint uVar1;
  
  if ((-1 < i) && (i < (p->vFanins).nSize)) {
    uVar1 = 1;
    if ((p->vFanins).pArray[(uint)i].nSize < 1) {
      if ((p->vFanouts).nSize <= i) goto LAB_00531493;
      uVar1 = (uint)(0 < (p->vFanouts).pArray[(uint)i].nSize);
    }
    return uVar1;
  }
LAB_00531493:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Sfm_NodeReadUsed( Sfm_Ntk_t * p, int i )
{
    return (Sfm_ObjFaninNum(p, i) > 0) || (Sfm_ObjFanoutNum(p, i) > 0);
}